

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O1

CURLcode setname(curl_mimepart *part,char *name,size_t len)

{
  CURLcode CVar1;
  char *name_00;
  
  if (name != (char *)0x0 && len != 0) {
    name_00 = (char *)(*Curl_cmalloc)(len + 1);
    if (name_00 == (char *)0x0) {
      CVar1 = CURLE_OUT_OF_MEMORY;
    }
    else {
      memcpy(name_00,name,len);
      name_00[len] = '\0';
      CVar1 = curl_mime_name(part,name_00);
      (*Curl_cfree)(name_00);
    }
    return CVar1;
  }
  CVar1 = curl_mime_name(part,name);
  return CVar1;
}

Assistant:

static CURLcode setname(curl_mimepart *part, const char *name, size_t len)
{
  char *zname;
  CURLcode res;

  if(!name || !len)
    return curl_mime_name(part, name);
  zname = malloc(len + 1);
  if(!zname)
    return CURLE_OUT_OF_MEMORY;
  memcpy(zname, name, len);
  zname[len] = '\0';
  res = curl_mime_name(part, zname);
  free(zname);
  return res;
}